

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O1

void __thiscall TPZFrontNonSym<long_double>::Compress(TPZFrontNonSym<long_double> *this)

{
  long *plVar1;
  long *plVar2;
  longdouble *plVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  longdouble *plVar8;
  long lVar9;
  longdouble *plVar10;
  long lVar11;
  TPZStack<long,_10> from;
  TPZManVector<long,_10> local_90;
  
  TPZStack<long,_10>::TPZStack((TPZStack<long,_10> *)&local_90);
  if (0 < (this->super_TPZFront<long_double>).fFront) {
    lVar11 = 0;
    do {
      if ((this->super_TPZFront<long_double>).fGlobal.super_TPZVec<long>.fStore[lVar11] != -1) {
        TPZStack<long,_10>::Push((TPZStack<long,_10> *)&local_90,lVar11);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (this->super_TPZFront<long_double>).fFront);
  }
  if (local_90.super_TPZVec<long>.fNElements < 1) {
    lVar11 = 0;
  }
  else {
    plVar1 = (this->super_TPZFront<long_double>).fGlobal.super_TPZVec<long>.fStore;
    plVar2 = (this->super_TPZFront<long_double>).fLocal.fStore;
    lVar7 = 0;
    do {
      lVar11 = plVar1[local_90.super_TPZVec<long>.fStore[lVar7]];
      plVar1[lVar7] = lVar11;
      plVar2[lVar11] = lVar7;
      lVar7 = lVar7 + 1;
      lVar11 = local_90.super_TPZVec<long>.fNElements;
    } while (local_90.super_TPZVec<long>.fNElements != lVar7);
  }
  if (lVar11 < (this->super_TPZFront<long_double>).fGlobal.super_TPZVec<long>.fNElements) {
    plVar1 = (this->super_TPZFront<long_double>).fGlobal.super_TPZVec<long>.fStore;
    do {
      plVar1[lVar11] = -1;
      lVar11 = lVar11 + 1;
    } while (lVar11 < (this->super_TPZFront<long_double>).fGlobal.super_TPZVec<long>.fNElements);
  }
  if ((this->super_TPZFront<long_double>).fFree.super_TPZManVector<int,_10>.super_TPZVec<int>.
      fNElements + local_90.super_TPZVec<long>.fNElements !=
      (this->super_TPZFront<long_double>).fFront) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"TPZFront.Compress inconsistent data structure\n",0x2e);
  }
  (this->super_TPZFront<long_double>).fFront = local_90.super_TPZVec<long>.fNElements;
  TPZManVector<int,_10>::Resize
            (&(this->super_TPZFront<long_double>).fFree.super_TPZManVector<int,_10>,0);
  TPZManVector<long,_10>::Resize
            (&(this->super_TPZFront<long_double>).fGlobal,(this->super_TPZFront<long_double>).fFront
            );
  if (0 < local_90.super_TPZVec<long>.fNElements &&
      (this->super_TPZFront<long_double>).fData.fNElements != 0) {
    lVar11 = (long)(this->super_TPZFront<long_double>).fMaxFront;
    plVar3 = (this->super_TPZFront<long_double>).fData.fStore;
    lVar7 = 0;
    plVar8 = plVar3;
    do {
      lVar4 = local_90.super_TPZVec<long>.fStore[lVar7];
      lVar9 = lVar4 * lVar11;
      lVar6 = 0;
      plVar10 = plVar8;
      do {
        lVar5 = local_90.super_TPZVec<long>.fStore[lVar6];
        *plVar10 = plVar3[lVar9 + lVar5];
        if (lVar5 != lVar6 || lVar4 != lVar7) {
          plVar3[lVar9 + lVar5] = (longdouble)0;
        }
        lVar6 = lVar6 + 1;
        plVar10 = plVar10 + 1;
      } while (local_90.super_TPZVec<long>.fNElements != lVar6);
      lVar7 = lVar7 + 1;
      plVar8 = plVar8 + lVar11;
    } while (lVar7 != local_90.super_TPZVec<long>.fNElements);
  }
  TPZManVector<long,_10>::~TPZManVector(&local_90);
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::Compress(){
	//	PrintGlobal("Before COmpress");
	//	Print("Before Compress", cout);
	TPZStack <int64_t> from;
	int64_t nfound;
	int64_t i, j;
	for(i = 0; i < this->fFront; i++){
		if(this->fGlobal[i] != -1) from.Push(i);
	}
	
	/**
	 *First this->fLocal initialization
	 *Any needed updates is done on next loop
	 */
	nfound = from.NElements();
	for(i=0;i<nfound;i++) {
		this->fGlobal[i]=this->fGlobal[from[i]];
		//this->fGlobal[from[i]] = -1;
		this->fLocal[this->fGlobal[i]] = i;
	}
	for(;i<this->fGlobal.NElements();i++) this->fGlobal[i] = -1;
	
	if(nfound+this->fFree.NElements()!=this->fFront) cout << "TPZFront.Compress inconsistent data structure\n";
	
	this->fFront = nfound;
	this->fFree.Resize(0);	
	this->fGlobal.Resize(this->fFront);
	if(this->fData.NElements()==0) return;
	
	for(j = 0; j < nfound; j++){
		for(i = 0; i < nfound; i++){
			Element(i,j) = Element(from[i], from[j]);
			if(from[i]!=i || from[j]!=j) Element(from[i],from[j])=0.;
		}
	}
}